

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_bias_or_compare
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  RenderContext *pRVar4;
  DataType dataType;
  DataType dataType_00;
  DataType thirdArgumentDataType;
  undefined1 *in_stack_ffffffffffffea78;
  bool local_1511;
  bool local_13d9;
  string local_e70;
  undefined1 local_e50 [8];
  string shaderSource_51;
  undefined1 local_e10 [8];
  string shaderSource_50;
  undefined1 local_dd0 [8];
  string shaderSource_49;
  string local_da8;
  deUint32 local_d88;
  ContextType local_d84;
  string local_d80;
  undefined1 local_d60 [8];
  string shaderSource_48;
  undefined1 local_d20 [8];
  string shaderSource_47;
  undefined1 local_ce0 [8];
  string shaderSource_46;
  undefined1 local_ca0 [8];
  string shaderSource_45;
  undefined1 local_c60 [8];
  string shaderSource_44;
  undefined1 local_c20 [8];
  string shaderSource_43;
  undefined1 local_be0 [8];
  string shaderSource_42;
  undefined1 local_ba0 [8];
  string shaderSource_41;
  undefined1 local_b60 [8];
  string shaderSource_40;
  string local_b38;
  deUint32 local_b18;
  ContextType local_b14;
  string local_b10;
  undefined1 local_af0 [8];
  string shaderSource_39;
  undefined1 local_ab0 [8];
  string shaderSource_38;
  undefined1 local_a70 [8];
  string shaderSource_37;
  undefined1 local_a30 [8];
  string shaderSource_36;
  undefined1 local_9f0 [8];
  string shaderSource_35;
  undefined1 local_9b0 [8];
  string shaderSource_34;
  undefined1 local_970 [8];
  string shaderSource_33;
  undefined1 local_930 [8];
  string shaderSource_32;
  undefined1 local_8f0 [8];
  string shaderSource_31;
  undefined1 local_8b0 [8];
  string shaderSource_30;
  undefined1 local_870 [8];
  string shaderSource_29;
  undefined1 local_830 [8];
  string shaderSource_28;
  undefined1 local_7f0 [8];
  string shaderSource_27;
  undefined1 local_7b0 [8];
  string shaderSource_26;
  undefined1 local_770 [8];
  string shaderSource_25;
  undefined1 local_730 [8];
  string shaderSource_24;
  undefined1 local_6f0 [8];
  string shaderSource_23;
  undefined1 local_6b0 [8];
  string shaderSource_22;
  undefined1 local_670 [8];
  string shaderSource_21;
  undefined1 local_630 [8];
  string shaderSource_20;
  undefined1 local_5f0 [8];
  string shaderSource_19;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  undefined1 local_530 [8];
  string shaderSource_18;
  undefined1 local_4f0 [8];
  string shaderSource_17;
  undefined1 local_4b0 [8];
  string shaderSource_16;
  undefined1 local_470 [8];
  string shaderSource_15;
  undefined1 local_430 [8];
  string shaderSource_14;
  undefined1 local_3f0 [8];
  string shaderSource_13;
  undefined1 local_3b0 [8];
  string shaderSource_12;
  undefined1 local_370 [8];
  string shaderSource_11;
  undefined1 local_330 [8];
  string shaderSource_10;
  undefined1 local_2f0 [8];
  string shaderSource_9;
  undefined1 local_2b0 [8];
  string shaderSource_8;
  undefined1 local_270 [8];
  string shaderSource_7;
  undefined1 local_230 [8];
  string shaderSource_6;
  undefined1 local_1f0 [8];
  string shaderSource_5;
  undefined1 local_1b0 [8];
  string shaderSource_4;
  undefined1 local_170 [8];
  string shaderSource_3;
  undefined1 local_130 [8];
  string shaderSource_2;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"texture: Invalid bias/compare type.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar2 = local_10;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataTypeNdx,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      for (shaderSource.field_2._8_4_ = 0; (int)shaderSource.field_2._8_4_ < 4;
          shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x28,TYPE_FLOAT_VEC2,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_b0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x35,TYPE_FLOAT_VEC2,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_f0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_130,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x3c,TYPE_FLOAT_VEC2,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_130);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_130);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_170,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x28,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_170);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_170);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x35,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x35,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_1f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_230,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3c,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_230);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_230);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_270,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3c,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_270);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_270);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_2b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3c,TYPE_FLOAT_VEC2,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_9.field_2._M_local_buf + 8),(string *)local_2b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_9.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_9.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_2b0);
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_2f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x2c,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_10.field_2._M_local_buf + 8),(string *)local_2f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_10.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_10.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2f0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_330,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x39,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_11.field_2._M_local_buf + 8),(string *)local_330);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_11.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_11.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_330);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_370,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x40,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_12.field_2._M_local_buf + 8),(string *)local_370);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_12.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_12.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_370);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_3b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2c,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_13.field_2._M_local_buf + 8),(string *)local_3b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_13.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_13.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_3b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_3f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2c,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_14.field_2._M_local_buf + 8),(string *)local_3f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_14.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_14.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_3f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_430,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x39,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_15.field_2._M_local_buf + 8),(string *)local_430);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_15.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_15.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_430);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_470,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x39,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_16.field_2._M_local_buf + 8),(string *)local_470);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_16.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_16.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_470);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_4b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x40,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_17.field_2._M_local_buf + 8),(string *)local_4b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_17.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_17.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_4b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_4f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x40,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_18.field_2._M_local_buf + 8),(string *)local_4f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_18.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_18.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_4f0);
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_530,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x29,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_550,(string *)local_530);
          verifyShader(pNVar2,SVar1,&local_550);
          std::__cxx11::string::~string((string *)&local_550);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_570,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x36,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          std::__cxx11::string::operator=((string *)local_530,(string *)&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_590,(string *)local_530);
          verifyShader(pNVar2,SVar1,&local_590);
          std::__cxx11::string::~string((string *)&local_590);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_5b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x3d,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          std::__cxx11::string::operator=((string *)local_530,(string *)&local_5b0);
          std::__cxx11::string::~string((string *)&local_5b0);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_19.field_2._M_local_buf + 8),(string *)local_530);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_19.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_19.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_530);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_5f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x29,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_20.field_2._M_local_buf + 8),(string *)local_5f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_20.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_20.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_5f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_630,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x29,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_21.field_2._M_local_buf + 8),(string *)local_630);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_21.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_21.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_630);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_670,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x36,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_22.field_2._M_local_buf + 8),(string *)local_670);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_22.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_22.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_670);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_6b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x36,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_23.field_2._M_local_buf + 8),(string *)local_6b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_23.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_23.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_6f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3d,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_24.field_2._M_local_buf + 8),(string *)local_6f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_24.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_24.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_730,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3d,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_25.field_2._M_local_buf + 8),(string *)local_730);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_25.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_25.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_730);
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_770,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x2b,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_26.field_2._M_local_buf + 8),(string *)local_770);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_26.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_26.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_770);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_7b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x38,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_27.field_2._M_local_buf + 8),(string *)local_7b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_27.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_27.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_7b0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_7f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x3f,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_28.field_2._M_local_buf + 8),(string *)local_7f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_28.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_28.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_7f0);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_830,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2b,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_29.field_2._M_local_buf + 8),(string *)local_830);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_29.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_29.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_830);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_870,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2b,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_30.field_2._M_local_buf + 8),(string *)local_870);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_30.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_30.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_870);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_8b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x38,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_31.field_2._M_local_buf + 8),(string *)local_8b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_31.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_31.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_8b0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_8f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x38,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_32.field_2._M_local_buf + 8),(string *)local_8f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_32.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_32.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_8f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_930,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3f,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_33.field_2._M_local_buf + 8),(string *)local_930);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_33.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_33.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_930);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_970,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x3f,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_34.field_2._M_local_buf + 8),(string *)local_970);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_34.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_34.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_970);
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_9b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x2f,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_35.field_2._M_local_buf + 8),(string *)local_9b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_35.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_35.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_9b0);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_9f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2f,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_36.field_2._M_local_buf + 8),(string *)local_9f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_36.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_36.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_9f0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_a30,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x2f,TYPE_FLOAT_VEC3,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_37.field_2._M_local_buf + 8),(string *)local_a30);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_37.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_37.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_a30);
        if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_a70,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x30,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_38.field_2._M_local_buf + 8),(string *)local_a70);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_38.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_38.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_a70);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_ab0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x30,TYPE_FLOAT_VEC4,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_39.field_2._M_local_buf + 8),(string *)local_ab0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_39.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_39.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_ab0);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_af0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_48 * 4),0x30,TYPE_FLOAT_VEC4,
                   *(DataType *)
                    (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                    (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)
                 (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string((string *)&local_b10,(string *)local_af0);
        verifyShader(pNVar2,SVar1,&local_b10);
        std::__cxx11::string::~string((string *)&local_b10);
        std::__cxx11::string::~string((string *)local_af0);
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_b14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_b18 = (deUint32)glu::ApiType::es(3,2);
        bVar3 = glu::contextSupports(local_b14,(ApiType)local_b18);
        pNVar2 = local_10;
        shaderSource_40.field_2._M_local_buf[0xf] = '\0';
        local_13d9 = true;
        if (!bVar3) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_b38,(_anonymous_namespace_ *)0x2d,dataType);
          shaderSource_40.field_2._M_local_buf[0xf] = '\x01';
          local_13d9 = NegativeTestContext::isExtensionSupported(pNVar2,&local_b38);
        }
        if ((shaderSource_40.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_b38);
        }
        if (local_13d9 != false) {
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_b60,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_48 * 4),0x2d,TYPE_FLOAT_VEC4,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),
                       (DataType)in_stack_ffffffffffffea78);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_41.field_2._M_local_buf + 8),(string *)local_b60);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_41.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_41.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_b60);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_ba0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_48 * 4),0x3a,TYPE_FLOAT_VEC4,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),
                       (DataType)in_stack_ffffffffffffea78);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_42.field_2._M_local_buf + 8),(string *)local_ba0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_42.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_42.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_ba0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_be0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_48 * 4),0x41,TYPE_FLOAT_VEC4,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),
                       (DataType)in_stack_ffffffffffffea78);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_43.field_2._M_local_buf + 8),(string *)local_be0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_43.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_43.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_be0);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_c20,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x2d,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_44.field_2._M_local_buf + 8),(string *)local_c20);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_44.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_44.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_c20);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_c60,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x2d,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_45.field_2._M_local_buf + 8),(string *)local_c60);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_45.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_45.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_c60);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_ca0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x3a,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_46.field_2._M_local_buf + 8),(string *)local_ca0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_46.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_46.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_ca0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_ce0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x3a,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_47.field_2._M_local_buf + 8),(string *)local_ce0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_47.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_47.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_ce0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_d20,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x41,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_48.field_2._M_local_buf + 8),(string *)local_d20);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_48.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_48.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_d20);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_d60,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x41,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),(DataType)in_stack_ffffffffffffea78
                    );
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_d80,(string *)local_d60);
          verifyShader(pNVar2,SVar1,&local_d80);
          std::__cxx11::string::~string((string *)&local_d80);
          std::__cxx11::string::~string((string *)local_d60);
        }
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_d84.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_d88 = (deUint32)glu::ApiType::es(3,2);
        bVar3 = glu::contextSupports(local_d84,(ApiType)local_d88);
        pNVar2 = local_10;
        shaderSource_49.field_2._M_local_buf[0xf] = '\0';
        local_1511 = true;
        if (!bVar3) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_da8,(_anonymous_namespace_ *)0x33,dataType_00);
          shaderSource_49.field_2._M_local_buf[0xf] = '\x01';
          local_1511 = NegativeTestContext::isExtensionSupported(pNVar2,&local_da8);
        }
        if ((shaderSource_49.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_da8);
        }
        thirdArgumentDataType = (DataType)in_stack_ffffffffffffea78;
        if (local_1511 != false) {
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_dd0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_48 * 4),0x33,TYPE_FLOAT_VEC4,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),thirdArgumentDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_50.field_2._M_local_buf + 8),(string *)local_dd0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_50.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_50.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_dd0);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_e10,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x33,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),thirdArgumentDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_51.field_2._M_local_buf + 8),(string *)local_e10);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_51.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_51.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e10);
          in_stack_ffffffffffffea78 = NegativeTestShared::(anonymous_namespace)::s_shaders;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_e50,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),0x33,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),0x2c264e0);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)(in_stack_ffffffffffffea78 + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_e70,(string *)local_e50);
          verifyShader(pNVar2,SVar1,&local_e70);
          std::__cxx11::string::~string((string *)&local_e70);
          std::__cxx11::string::~string((string *)local_e50);
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_invalid_bias_or_compare (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid bias/compare type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}